

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O0

void __thiscall Lists<std::shared_ptr<Itemset>_>::Lists(Lists<std::shared_ptr<Itemset>_> *this)

{
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> local_30;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> local_20;
  Lists<std::shared_ptr<Itemset>_> *local_10;
  Lists<std::shared_ptr<Itemset>_> *this_local;
  
  local_10 = this;
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr(&this->theHead);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr(&this->theLast);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=(&this->theHead,&local_20);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&local_20);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr(&local_30,(nullptr_t)0x0);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=(&this->theLast,&local_30);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&local_30);
  this->theSize = 0;
  return;
}

Assistant:

Lists<T>::Lists() {
    theHead = 0;
    theLast = 0;
    theSize = 0;
}